

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_resize
                (uchar *pixels,int type,int w,int h,int stride,int target_width,int target_height,
                Allocator *allocator)

{
  int in_ECX;
  uint in_EDX;
  uchar *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_stack_00000008;
  int in_stack_00000010;
  Mat dst_2;
  Mat dst_1;
  Mat dst;
  int type_from;
  Allocator *in_stack_fffffffffffffcb0;
  Allocator *in_stack_fffffffffffffcb8;
  void **ppvVar1;
  size_t in_stack_fffffffffffffcc0;
  int iVar2;
  undefined8 in_stack_fffffffffffffcc8;
  int _w;
  Mat *in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  undefined8 in_stack_fffffffffffffce8;
  uchar *in_stack_fffffffffffffcf0;
  Allocator *in_stack_fffffffffffffd50;
  void *local_280;
  int *local_278;
  undefined8 local_270;
  undefined4 local_268;
  long *local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined8 local_240;
  void *local_238;
  int *local_230;
  undefined8 local_228;
  undefined4 local_220;
  long *local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined8 local_1f8;
  void *local_1e0;
  int *local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  long *local_1c0;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined8 local_1a0;
  uint local_194;
  uchar *local_180;
  void **local_168;
  void **local_158;
  int in_stack_fffffffffffffeb4;
  uchar *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 uVar3;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 uVar4;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  
  if ((in_ECX == in_stack_00000008) && (in_R8D == in_stack_00000010)) {
    from_pixels(in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                (int)in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                in_stack_fffffffffffffd50);
  }
  else {
    local_194 = in_EDX & 0xffff;
    iVar2 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    _w = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    if ((local_194 == 1) || (local_194 == 2)) {
      uVar4 = 3;
      uVar3 = 0;
      local_1e0 = (void *)0x0;
      local_1d8 = (int *)0x0;
      local_1d0 = 0;
      local_1c8 = 0;
      local_1c0 = (long *)0x0;
      local_1b8 = 0;
      local_1b4 = 0;
      local_1b0 = 0;
      local_1ac = 0;
      local_1a8 = 0;
      local_1a0 = 0;
      create(in_stack_fffffffffffffcd0,_w,(int)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
             iVar2,in_stack_fffffffffffffcb0);
      iVar2 = (int)(in_stack_fffffffffffffcc0 >> 0x20);
      resize_bilinear_c3((uchar *)CONCAT44(uVar4,in_stack_fffffffffffffed0),
                         (int)((ulong)uVar3 >> 0x20),(int)uVar3,in_stack_fffffffffffffec4,
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
      from_pixels((uchar *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20)
                  ,(int)in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
      local_168 = &local_1e0;
      if (local_1d8 != (int *)0x0) {
        LOCK();
        iVar2 = *local_1d8;
        *local_1d8 = *local_1d8 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_1c0 == (long *)0x0) {
            if (local_1e0 != (void *)0x0) {
              free(local_1e0);
            }
          }
          else {
            (**(code **)(*local_1c0 + 0x18))(local_1c0,local_1e0);
          }
        }
      }
    }
    else if (local_194 == 3) {
      local_238 = (void *)0x0;
      local_230 = (int *)0x0;
      local_228 = 0;
      local_220 = 0;
      local_218 = (long *)0x0;
      local_210 = 0;
      local_20c = 0;
      local_208 = 0;
      local_204 = 0;
      local_200 = 0;
      local_1f8 = 0;
      create(in_stack_fffffffffffffcd0,_w,(int)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
             iVar2,in_stack_fffffffffffffcb0);
      iVar2 = (int)(in_stack_fffffffffffffcc0 >> 0x20);
      resize_bilinear_c1((uchar *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                         (int)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
      from_pixels((uchar *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20)
                  ,(int)in_stack_fffffffffffffcc8,iVar2,in_stack_fffffffffffffcb8);
      local_158 = &local_238;
      if (local_230 != (int *)0x0) {
        LOCK();
        iVar2 = *local_230;
        *local_230 = *local_230 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_218 == (long *)0x0) {
            if (local_238 != (void *)0x0) {
              free(local_238);
            }
          }
          else {
            (**(code **)(*local_218 + 0x18))(local_218,local_238);
          }
        }
      }
    }
    else if ((local_194 == 4) || (local_194 == 5)) {
      ppvVar1 = &local_280;
      local_280 = (void *)0x0;
      local_278 = (int *)0x0;
      local_270 = 0;
      local_268 = 0;
      local_260 = (long *)0x0;
      local_258 = 0;
      local_254 = 0;
      local_250 = 0;
      local_24c = 0;
      local_248 = 0;
      local_240 = 0;
      local_180 = in_RSI;
      create(in_stack_fffffffffffffcd0,(int)((ulong)ppvVar1 >> 0x20),(int)ppvVar1,
             in_stack_fffffffffffffcc0,iVar2,in_stack_fffffffffffffcb0);
      resize_bilinear_c4((uchar *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                         (int)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                         in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
      from_pixels(local_180,(int)((ulong)ppvVar1 >> 0x20),(int)ppvVar1,
                  (int)((ulong)local_280 >> 0x20),in_stack_fffffffffffffcb8);
      ppvVar1 = &local_280;
      if (local_278 != (int *)0x0) {
        LOCK();
        iVar2 = *local_278;
        *local_278 = *local_278 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_260 == (long *)0x0) {
            if (local_280 != (void *)0x0) {
              free(local_280);
            }
          }
          else {
            (**(code **)(*local_260 + 0x18))(local_260,local_280);
          }
        }
      }
      *ppvVar1 = (void *)0x0;
      ppvVar1[2] = (void *)0x0;
      *(undefined4 *)(ppvVar1 + 3) = 0;
      *(undefined4 *)(ppvVar1 + 5) = 0;
      *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
      *(undefined4 *)(ppvVar1 + 6) = 0;
      *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
      *(undefined4 *)(ppvVar1 + 7) = 0;
      ppvVar1[8] = (void *)0x0;
      ppvVar1[1] = (void *)0x0;
    }
    else {
      fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
      fprintf(_stderr,"\n");
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}